

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_clump.c
# Opt level: O0

REF_STATUS ref_clump_short_edges_twod(REF_GRID ref_grid)

{
  uint uVar1;
  double local_478;
  double local_470;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss;
  char filename [1024];
  double local_50;
  REF_DBL edge_ratio;
  int local_40;
  REF_INT edge;
  REF_INT node1;
  REF_INT node0;
  REF_INT node;
  REF_INT ntarget;
  REF_DBL *ratio;
  REF_EDGE ref_edge;
  REF_NODE ref_node;
  REF_GRID ref_grid_local;
  
  ref_edge = (REF_EDGE)ref_grid->node;
  ref_node = (REF_NODE)ref_grid;
  uVar1 = ref_edge_create((REF_EDGE *)&ratio,ref_grid);
  if (uVar1 == 0) {
    if (ref_edge->max < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x1e7
             ,"ref_clump_short_edges_twod","malloc ratio of REF_DBL negative");
      ref_grid_local._4_4_ = 1;
    }
    else {
      _node = malloc((long)ref_edge->max << 3);
      if (_node == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
               0x1e7,"ref_clump_short_edges_twod","malloc ratio of REF_DBL NULL");
        ref_grid_local._4_4_ = 2;
      }
      else {
        for (ref_private_macro_code_rss_2 = 0; ref_private_macro_code_rss_2 < ref_edge->max;
            ref_private_macro_code_rss_2 = ref_private_macro_code_rss_2 + 1) {
          *(double *)((long)_node + (long)ref_private_macro_code_rss_2 * 8) =
               *(double *)(*(long *)&ref_node[1].blank + 0x20) * 2.0;
        }
        for (edge_ratio._4_4_ = 0; edge_ratio._4_4_ < *(int *)ratio;
            edge_ratio._4_4_ = edge_ratio._4_4_ + 1) {
          edge = *(REF_INT *)((long)ratio[1] + (long)(edge_ratio._4_4_ << 1) * 4);
          local_40 = *(REF_INT *)((long)ratio[1] + (long)(edge_ratio._4_4_ * 2 + 1) * 4);
          uVar1 = ref_node_ratio((REF_NODE)ref_edge,edge,local_40,&local_50);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0x1ed,"ref_clump_short_edges_twod",(ulong)uVar1,"ratio");
            return uVar1;
          }
          if (local_50 <= *(double *)((long)_node + (long)edge * 8)) {
            local_470 = local_50;
          }
          else {
            local_470 = *(double *)((long)_node + (long)edge * 8);
          }
          *(double *)((long)_node + (long)edge * 8) = local_470;
          if (local_50 <= *(double *)((long)_node + (long)local_40 * 8)) {
            local_478 = local_50;
          }
          else {
            local_478 = *(double *)((long)_node + (long)local_40 * 8);
          }
          *(double *)((long)_node + (long)local_40 * 8) = local_478;
        }
        node0 = 0;
        for (node1 = 0; node1 < ref_edge->max; node1 = node1 + 1) {
          if (*(double *)((long)_node + (long)node1 * 8) <
              *(double *)(*(long *)&ref_node[1].blank + 0x20)) {
            snprintf((char *)&ref_malloc_init_i,0x400,"clump%d.t",(ulong)(uint)node0);
            uVar1 = ref_clump_tri_around((REF_GRID)ref_node,node1,(char *)&ref_malloc_init_i);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0x1f6,"ref_clump_short_edges_twod",(ulong)uVar1,"dump");
              return uVar1;
            }
            node0 = node0 + 1;
          }
        }
        ref_grid_local._4_4_ = 0;
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x1e4,
           "ref_clump_short_edges_twod",(ulong)uVar1,"orig edges");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_clump_short_edges_twod(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_EDGE ref_edge;
  REF_DBL *ratio;
  REF_INT ntarget;
  REF_INT node, node0, node1;
  REF_INT edge;
  REF_DBL edge_ratio;

  char filename[1024];

  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");

  ref_malloc_init(ratio, ref_node_max(ref_node), REF_DBL,
                  2.0 * ref_grid_adapt(ref_grid, collapse_ratio));

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);

    RSS(ref_node_ratio(ref_node, node0, node1, &edge_ratio), "ratio");
    ratio[node0] = MIN(ratio[node0], edge_ratio);
    ratio[node1] = MIN(ratio[node1], edge_ratio);
  }

  ntarget = 0;
  for (node = 0; node < ref_node_max(ref_node); node++)
    if (ratio[node] < ref_grid_adapt(ref_grid, collapse_ratio)) {
      snprintf(filename, 1024, "clump%d.t", ntarget);
      RSS(ref_clump_tri_around(ref_grid, node, filename), "dump");
      ntarget++;
    }

  return REF_SUCCESS;
}